

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O0

bool __thiscall
GenericModel::dropMimeData
          (GenericModel *this,QMimeData *data,DropAction action,int row,int column,
          QModelIndex *parent)

{
  int f1;
  bool bVar1;
  byte bVar2;
  GenericModel *pGVar3;
  GenericModelPrivate *this_00;
  GenericModelPrivate *d;
  QModelIndex *local_38;
  QModelIndex *parent_local;
  int local_28;
  int column_local;
  int row_local;
  DropAction action_local;
  QMimeData *data_local;
  GenericModel *this_local;
  
  local_38 = parent;
  parent_local._4_4_ = column;
  local_28 = row;
  column_local = action;
  _row_local = data;
  data_local = (QMimeData *)this;
  if (row < 0) {
    local_28 = (**(code **)(*(long *)this + 0x78))(this,parent);
  }
  if ((int)parent_local._4_4_ < 0) {
    parent_local._4_4_ = 0;
  }
  bVar1 = QModelIndex::isValid(local_38);
  if ((bVar1) && (pGVar3 = (GenericModel *)QModelIndex::model(local_38), pGVar3 != this)) {
    this_local._7_1_ = false;
  }
  else {
    f1 = column_local;
    if (_row_local == (QMimeData *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      d._0_4_ = (**(code **)(*(long *)this + 0xe8))();
      d._4_4_ = Qt::operator&(f1,d._0_4_);
      bVar1 = QFlags<Qt::DropAction>::operator!((QFlags<Qt::DropAction> *)((long)&d + 4));
      if (bVar1) {
        this_local._7_1_ = false;
      }
      else {
        this_00 = d_func(this);
        bVar1 = GenericModelPrivate::decodeMime
                          (this_00,_row_local,column_local,local_28,parent_local._4_4_,local_38);
        if (bVar1) {
          this_local._7_1_ = true;
        }
        else {
          bVar2 = QAbstractItemModel::dropMimeData
                            ((QMimeData *)this,(DropAction)_row_local,column_local,local_28,
                             (QModelIndex *)(ulong)parent_local._4_4_);
          this_local._7_1_ = (bool)(bVar2 & 1);
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool GenericModel::dropMimeData(const QMimeData *data, Qt::DropAction action, int row, int column, const QModelIndex &parent)
{
    if (row < 0)
        row = rowCount(parent);
    if (column < 0)
        column = 0;
    if (parent.isValid() && parent.model() != this)
        return false;
    if (!data)
        return false;
    if (!(action & supportedDropActions()))
        return false;
    Q_D(GenericModel);
    if (d->decodeMime(data, action, row, column, parent))
        return true;
    return QAbstractItemModel::dropMimeData(data, action, row, column, parent);
}